

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

size_t nghttp2_hd_deflate_bound(nghttp2_hd_deflater *deflater,nghttp2_nv *nva,size_t nvlen)

{
  size_t sVar1;
  size_t *psVar2;
  
  sVar1 = nvlen * 0xc + 0xc;
  if (nvlen != 0) {
    psVar2 = &nva->valuelen;
    do {
      sVar1 = sVar1 + psVar2[-1] + *psVar2;
      psVar2 = psVar2 + 5;
      nvlen = nvlen - 1;
    } while (nvlen != 0);
  }
  return sVar1;
}

Assistant:

size_t nghttp2_hd_deflate_bound(nghttp2_hd_deflater *deflater,
                                const nghttp2_nv *nva, size_t nvlen) {
  size_t n = 0;
  size_t i;
  (void)deflater;

  /* Possible Maximum Header Table Size Change.  Encoding (1u << 31) -
     1 using 4 bit prefix requires 6 bytes.  We may emit this at most
     twice. */
  n += 12;

  /* Use Literal Header Field without indexing - New Name, since it is
     most space consuming format.  Also we choose the less one between
     non-huffman and huffman, so using literal byte count is
     sufficient for upper bound.

     Encoding (1u << 31) - 1 using 7 bit prefix requires 6 bytes.  We
     need 2 of this for |nvlen| header fields. */
  n += 6 * 2 * nvlen;

  for (i = 0; i < nvlen; ++i) {
    n += nva[i].namelen + nva[i].valuelen;
  }

  return n;
}